

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<char,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          char value,basic_format_specs<char> *spec)

{
  char spec_00;
  int_writer<char,_fmt::v5::basic_format_specs<char>_> local_30;
  
  spec_00 = (spec->super_core_format_specs).type;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  int_writer<char,_fmt::v5::basic_format_specs<char>_>::int_writer
            (&local_30,
             (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             this,value,spec);
  internal::
  handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>>
            (spec_00,&local_30);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }